

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOAnimation.cpp
# Opt level: O2

void __thiscall
Assimp::LWO::AnimResolver::InterpolateTrack
          (AnimResolver *this,vector<aiVectorKey,_std::allocator<aiVectorKey>_> *out,
          aiVectorKey *fill,double time)

{
  const_iterator cVar1;
  pointer pKVar2;
  float *pfVar3;
  
  fill->mTime = time;
  cVar1._M_current = (this->cur_x)._M_current;
  if (((cVar1._M_current)->time != time) || (NAN((cVar1._M_current)->time) || NAN(time))) {
    DoInterpolation(this,cVar1,this->envl_x,time,&(fill->mValue).x);
  }
  else {
    (fill->mValue).x = (cVar1._M_current)->value;
    pKVar2 = (this->cur_x)._M_current;
    if (pKVar2 == (this->envl_x->keys).
                  super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1) {
      this->end_x = true;
    }
    else {
      (this->cur_x)._M_current = pKVar2 + 1;
    }
  }
  cVar1._M_current = (this->cur_y)._M_current;
  pfVar3 = &(fill->mValue).y;
  if (((cVar1._M_current)->time != time) || (NAN((cVar1._M_current)->time) || NAN(time))) {
    DoInterpolation(this,cVar1,this->envl_y,time,pfVar3);
  }
  else {
    *pfVar3 = (cVar1._M_current)->value;
    pKVar2 = (this->cur_y)._M_current;
    if (pKVar2 == (this->envl_y->keys).
                  super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1) {
      this->end_y = true;
    }
    else {
      (this->cur_y)._M_current = pKVar2 + 1;
    }
  }
  cVar1._M_current = (this->cur_z)._M_current;
  pfVar3 = &(fill->mValue).z;
  if (((cVar1._M_current)->time == time) && (!NAN((cVar1._M_current)->time) && !NAN(time))) {
    *pfVar3 = (cVar1._M_current)->value;
    pKVar2 = (this->cur_z)._M_current;
    if (pKVar2 == (this->envl_z->keys).
                  super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1) {
      this->end_x = true;
    }
    else {
      (this->cur_z)._M_current = pKVar2 + 1;
    }
    return;
  }
  DoInterpolation(this,cVar1,this->envl_z,time,pfVar3);
  return;
}

Assistant:

void AnimResolver::InterpolateTrack(std::vector<aiVectorKey>& out,aiVectorKey& fill,double time)
{
    // subsample animation track?
    if (flags & AI_LWO_ANIM_FLAG_SAMPLE_ANIMS) {
        SubsampleAnimTrack(out,time, sample_delta);
    }

    fill.mTime = time;

    // get x
    if ((*cur_x).time == time) {
        fill.mValue.x = (*cur_x).value;

        if (cur_x != envl_x->keys.end()-1) /* increment x */
            ++cur_x;
        else end_x = true;
    }
    else DoInterpolation(cur_x,envl_x,time,(float&)fill.mValue.x);

    // get y
    if ((*cur_y).time == time) {
        fill.mValue.y = (*cur_y).value;

        if (cur_y != envl_y->keys.end()-1) /* increment y */
            ++cur_y;
        else end_y = true;
    }
    else DoInterpolation(cur_y,envl_y,time,(float&)fill.mValue.y);

    // get z
    if ((*cur_z).time == time) {
        fill.mValue.z = (*cur_z).value;

        if (cur_z != envl_z->keys.end()-1) /* increment z */
            ++cur_z;
        else end_x = true;
    }
    else DoInterpolation(cur_z,envl_z,time,(float&)fill.mValue.z);
}